

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O3

uint64_t ReadCompactSize<SpanReader>(SpanReader *is,bool range_check)

{
  ulong uVar1;
  char *pcVar2;
  size_t in_RCX;
  long in_FS_OFFSET;
  uint8_t obj;
  byte local_30;
  undefined1 uStack_2f;
  undefined2 uStack_2e;
  int iStack_2c;
  undefined8 local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  SpanReader::read(is,(int)&local_30,(void *)0x1,in_RCX);
  uVar1 = (ulong)local_30;
  if (uVar1 < 0xfd) {
LAB_003c408d:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return uVar1;
    }
  }
  else {
    if (uVar1 == 0xfe) {
      SpanReader::read(is,(int)&local_30,(void *)0x4,in_RCX);
      uVar1 = (ulong)CONCAT22(uStack_2e,CONCAT11(uStack_2f,local_30));
      if (uVar1 < 0x10000) {
        pcVar2 = (char *)__cxa_allocate_exception(0x20);
        local_28 = std::iostream_category();
        local_30 = 1;
        uStack_2f = 0;
        uStack_2e = 0;
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar2,(error_code *)"non-canonical ReadCompactSize()");
      }
      else {
LAB_003c407d:
        if (!range_check || uVar1 < 0x2000001) goto LAB_003c408d;
        pcVar2 = (char *)__cxa_allocate_exception(0x20);
        local_28 = std::iostream_category();
        local_30 = 1;
        uStack_2f = 0;
        uStack_2e = 0;
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar2,(error_code *)"ReadCompactSize(): size too large");
      }
    }
    else if (local_30 == 0xfd) {
      SpanReader::read(is,(int)&local_30,(void *)0x2,in_RCX);
      uVar1 = (ulong)CONCAT11(uStack_2f,local_30);
      if (0xfc < uVar1) goto LAB_003c408d;
      pcVar2 = (char *)__cxa_allocate_exception(0x20);
      local_28 = std::iostream_category();
      local_30 = 1;
      uStack_2f = 0;
      uStack_2e = 0;
      std::ios_base::failure[abi:cxx11]::failure
                (pcVar2,(error_code *)"non-canonical ReadCompactSize()");
    }
    else {
      SpanReader::read(is,(int)&local_30,&DAT_00000008,in_RCX);
      uVar1 = CONCAT44(iStack_2c,CONCAT22(uStack_2e,CONCAT11(uStack_2f,local_30)));
      if (iStack_2c != 0) goto LAB_003c407d;
      pcVar2 = (char *)__cxa_allocate_exception(0x20);
      local_28 = std::iostream_category();
      local_30 = 1;
      uStack_2f = 0;
      uStack_2e = 0;
      std::ios_base::failure[abi:cxx11]::failure
                (pcVar2,(error_code *)"non-canonical ReadCompactSize()");
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      __cxa_throw(pcVar2,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  __stack_chk_fail();
}

Assistant:

uint64_t ReadCompactSize(Stream& is, bool range_check = true)
{
    uint8_t chSize = ser_readdata8(is);
    uint64_t nSizeRet = 0;
    if (chSize < 253)
    {
        nSizeRet = chSize;
    }
    else if (chSize == 253)
    {
        nSizeRet = ser_readdata16(is);
        if (nSizeRet < 253)
            throw std::ios_base::failure("non-canonical ReadCompactSize()");
    }
    else if (chSize == 254)
    {
        nSizeRet = ser_readdata32(is);
        if (nSizeRet < 0x10000u)
            throw std::ios_base::failure("non-canonical ReadCompactSize()");
    }
    else
    {
        nSizeRet = ser_readdata64(is);
        if (nSizeRet < 0x100000000ULL)
            throw std::ios_base::failure("non-canonical ReadCompactSize()");
    }
    if (range_check && nSizeRet > MAX_SIZE) {
        throw std::ios_base::failure("ReadCompactSize(): size too large");
    }
    return nSizeRet;
}